

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_cas2w_m68k(CPUM68KState_conflict *env,uint32_t regs,uint32_t a1,uint32_t a2)

{
  uint32_t uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  short sVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uintptr_t unaff_retaddr;
  short local_4c;
  short local_40;
  short local_3c;
  
  uVar8 = regs >> 9 & 7;
  uVar10 = regs >> 6 & 7;
  uVar7 = (uint32_t)(short)env->dregs[uVar8];
  uVar1 = env->dregs[uVar10];
  uVar2 = *(undefined4 *)((long)env->dregs + (ulong)(regs >> 1 & 0x1c));
  uVar3 = env->dregs[regs & 7];
  uVar4 = cpu_lduw_data_ra_m68k(env,a1,unaff_retaddr);
  uVar5 = cpu_lduw_data_ra_m68k(env,a2,unaff_retaddr);
  uVar9 = (uint32_t)(short)uVar4;
  sVar6 = (short)uVar5;
  if (uVar9 == uVar7) {
    local_4c = (short)uVar1;
    if (sVar6 == local_4c) {
      local_40 = (short)uVar2;
      cpu_stw_data_ra_m68k(env,a1,(int)local_40,unaff_retaddr);
      local_3c = (short)uVar3;
      cpu_stw_data_ra_m68k(env,a2,(int)local_3c,unaff_retaddr);
    }
    if (uVar9 == uVar7) {
      env->cc_n = (int)sVar6;
      uVar7 = (uint32_t)local_4c;
      goto LAB_006eeb7a;
    }
  }
  env->cc_n = uVar9;
LAB_006eeb7a:
  env->cc_v = uVar7;
  env->cc_op = 9;
  *(short *)(env->dregs + uVar8) = (short)uVar4;
  *(short *)(env->dregs + uVar10) = sVar6;
  return;
}

Assistant:

void HELPER(cas2w)(CPUM68KState *env, uint32_t regs, uint32_t a1, uint32_t a2)
{
    uint32_t Dc1 = extract32(regs, 9, 3);
    uint32_t Dc2 = extract32(regs, 6, 3);
    uint32_t Du1 = extract32(regs, 3, 3);
    uint32_t Du2 = extract32(regs, 0, 3);
    int16_t c1 = env->dregs[Dc1];
    int16_t c2 = env->dregs[Dc2];
    int16_t u1 = env->dregs[Du1];
    int16_t u2 = env->dregs[Du2];
    int16_t l1, l2;
    uintptr_t ra = GETPC();

    l1 = cpu_lduw_data_ra(env, a1, ra);
    l2 = cpu_lduw_data_ra(env, a2, ra);
    if (l1 == c1 && l2 == c2) {
        cpu_stw_data_ra(env, a1, u1, ra);
        cpu_stw_data_ra(env, a2, u2, ra);
    }

    if (c1 != l1) {
        env->cc_n = l1;
        env->cc_v = c1;
    } else {
        env->cc_n = l2;
        env->cc_v = c2;
    }
    env->cc_op = CC_OP_CMPW;
    env->dregs[Dc1] = deposit32(env->dregs[Dc1], 0, 16, l1);
    env->dregs[Dc2] = deposit32(env->dregs[Dc2], 0, 16, l2);
}